

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRingBuffer.hpp
# Opt level: O1

void __thiscall de::RingBuffer<unsigned_char>::resize(RingBuffer<unsigned_char> *this,int newSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *_tmp_;
  long lVar6;
  
  puVar5 = (uchar *)operator_new__((long)newSize);
  iVar1 = this->m_numElements;
  if (0 < (long)iVar1) {
    puVar4 = this->m_buffer;
    iVar2 = this->m_back;
    iVar3 = this->m_size;
    lVar6 = 0;
    do {
      puVar5[lVar6] = puVar4[(iVar2 + (int)lVar6) % iVar3];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  this->m_front = iVar1;
  this->m_back = 0;
  this->m_size = newSize;
  puVar4 = this->m_buffer;
  this->m_buffer = puVar5;
  if (puVar4 != (uchar *)0x0) {
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

void RingBuffer<T>::resize (int newSize)
{
	DE_ASSERT(newSize >= m_numElements);
	T* buf = new T[newSize];

	try
	{
		// Copy old elements.
		for (int ndx = 0; ndx < m_numElements; ndx++)
			buf[ndx] = m_buffer[(m_back + ndx) % m_size];

		// Reset pointers.
		m_front		= m_numElements;
		m_back		= 0;
		m_size		= newSize;

		DE_SWAP(T*, buf, m_buffer);
		delete[] buf;
	}
	catch (...)
	{
		delete[] buf;
		throw;
	}
}